

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::absolute_y
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp *pMVar1;
  MicroOp local_1d [5];
  
  local_1d[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_1d);
    local_1d[1] = 0;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_1d + 1);
      if (type == Read) {
        local_1d[2] = 0x22;
        if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e9bde;
        pMVar1 = local_1d + 2;
      }
      else {
        local_1d[3] = 0x21;
        if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e9bde;
        pMVar1 = local_1d + 3;
      }
      (*target->_M_invoker)((_Any_data *)target,pMVar1);
      local_1d[4] = 8;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_1d + 4);
        read_write(type,is8bit,target);
        return;
      }
    }
  }
LAB_003e9bde:
  std::__throw_bad_function_call();
}

Assistant:

static void absolute_y(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// AAL.
		target(CycleFetchIncrementPC);			// AAH.

		if(type == AccessType::Read) {
			target(OperationConstructAbsoluteYRead);	// Calculate data address, potentially skipping the next fetch.
		} else {
			target(OperationConstructAbsoluteY);		// Calculate data address.
		}
		target(CycleFetchIncorrectDataAddress);	// Do the dummy read if necessary; OperationConstructAbsoluteYRead
												// will skip this if it isn't required.

		read_write(type, is8bit, target);
	}